

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BgzfStream_p.cpp
# Opt level: O3

void __thiscall
BamTools::Internal::BgzfStream::Open(BgzfStream *this,string *filename,OpenMode mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  IBamIODevice *pIVar3;
  BamException *this_00;
  string message;
  string deviceError;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  Close(this);
  pIVar3 = BamDeviceFactory::CreateDevice(filename);
  this->m_device = pIVar3;
  iVar2 = (*pIVar3->_vptr_IBamIODevice[4])(pIVar3,(ulong)mode);
  if ((char)iVar2 != '\0') {
    return;
  }
  (*this->m_device->_vptr_IBamIODevice[9])(&local_40);
  paVar1 = &local_80.field_2;
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"could not open BGZF stream: \n\t","");
  std::operator+(&local_60,&local_80,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  local_80._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"BgzfStream::Open","");
  BamException::BamException(this_00,&local_80,&local_60);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BgzfStream::Open(const std::string& filename, const IBamIODevice::OpenMode mode)
{

    // close current device if necessary
    Close();
    BT_ASSERT_X((m_device == 0),
                "BgzfStream::Open() - unable to properly close previous IO device");

    // retrieve new IO device depending on filename
    m_device = BamDeviceFactory::CreateDevice(filename);
    BT_ASSERT_X(m_device, "BgzfStream::Open() - unable to create IO device from filename");

    // if device fails to open
    if (!m_device->Open(mode)) {
        const std::string deviceError = m_device->GetErrorString();
        const std::string message = std::string("could not open BGZF stream: \n\t") + deviceError;
        throw BamException("BgzfStream::Open", message);
    }
}